

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>
::~CartesianProductGenerator
          (CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>
           *this)

{
  ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
  *in_RDI;
  
  in_RDI->_vptr_ParamGeneratorInterface = (_func_int **)&PTR__CartesianProductGenerator_01f6dac0;
  std::
  tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<unsigned_int>,_testing::internal::ParamGenerator<int>_>
  ::~tuple((tuple<testing::internal::ParamGenerator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamGenerator<libaom_test::TestMode>,_testing::internal::ParamGenerator<int>,_testing::internal::ParamGenerator<unsigned_int>,_testing::internal::ParamGenerator<int>_>
            *)0x7a54ba);
  ParamGeneratorInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_unsigned_int,_int>_>
  ::~ParamGeneratorInterface(in_RDI);
  return;
}

Assistant:

~CartesianProductGenerator() override {}